

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprAddChildren(Fts5ExprNode *p,Fts5ExprNode *pSub)

{
  int iVar1;
  int nByte;
  Fts5ExprNode *pSub_local;
  Fts5ExprNode *p_local;
  
  if ((p->eType == 3) || (pSub->eType != p->eType)) {
    iVar1 = p->nChild;
    p->nChild = iVar1 + 1;
    p->apChild[iVar1] = pSub;
  }
  else {
    memcpy(p->apChild + p->nChild,pSub->apChild,(long)(pSub->nChild << 3));
    p->nChild = pSub->nChild + p->nChild;
    sqlite3_free(pSub);
  }
  return;
}

Assistant:

static void fts5ExprAddChildren(Fts5ExprNode *p, Fts5ExprNode *pSub){
  if( p->eType!=FTS5_NOT && pSub->eType==p->eType ){
    int nByte = sizeof(Fts5ExprNode*) * pSub->nChild;
    memcpy(&p->apChild[p->nChild], pSub->apChild, nByte);
    p->nChild += pSub->nChild;
    sqlite3_free(pSub);
  }else{
    p->apChild[p->nChild++] = pSub;
  }
}